

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetDyndepFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = this->LocalGenerator;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->HomeRelativeOutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->HomeRelativeOutputPath)._M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (local_40,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetDyndepFilePath(
  std::string const& lang) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += "/";
  }
  path += this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  path += "/";
  path += lang;
  path += ".dd";
  return path;
}